

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

string * __thiscall
leveldb::InternalKey::DebugString_abi_cxx11_(string *__return_storage_ptr__,InternalKey *this)

{
  ulong uVar1;
  ostream *poVar2;
  Slice *value;
  ostringstream ss;
  ParsedInternalKey local_1e8;
  pointer local_1c8;
  size_type local_1c0;
  string local_1b8;
  ostringstream local_198 [376];
  
  uVar1 = (this->rep_)._M_string_length;
  if (7 < uVar1) {
    local_1e8.user_key.data_ = (this->rep_)._M_dataplus._M_p;
    local_1e8.type = (ValueType)*(ulong *)(local_1e8.user_key.data_ + (uVar1 - 8)) & 0xff;
    local_1e8.sequence = *(ulong *)(local_1e8.user_key.data_ + (uVar1 - 8)) >> 8;
    local_1e8.user_key.size_ = uVar1 - 8;
    if (local_1e8.type < 2) {
      ParsedInternalKey::DebugString_abi_cxx11_(__return_storage_ptr__,&local_1e8);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"(bad)");
  local_1c8 = (this->rep_)._M_dataplus._M_p;
  local_1c0 = (this->rep_)._M_string_length;
  EscapeString_abi_cxx11_(&local_1b8,(leveldb *)&local_1c8,value);
  std::operator<<(poVar2,(string *)&local_1b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InternalKey::DebugString() const {
  ParsedInternalKey parsed;
  if (ParseInternalKey(rep_, &parsed)) {
    return parsed.DebugString();
  }
  std::ostringstream ss;
  ss << "(bad)" << EscapeString(rep_);
  return ss.str();
}